

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

QString * __thiscall
QFileSystemModel::filePath
          (QString *__return_storage_ptr__,QFileSystemModel *this,QModelIndex *index)

{
  QFileSystemModelPrivate *this_00;
  undefined8 uVar1;
  Data *pDVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  bool bVar6;
  char cVar7;
  QFileSystemNode *pQVar8;
  long in_FS_OFFSET;
  QFileInfo resolvedInfo;
  QFileInfo fullPathInfo;
  Data *local_88;
  undefined1 local_80 [24];
  QArrayDataPointer<char16_t> local_68;
  Data *local_50;
  QArrayDataPointer<char16_t> local_48;
  Data *local_30;
  
  local_30 = *(Data **)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileSystemModelPrivate **)&this->field_0x8;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemModelPrivate::filePath((QString *)&local_48,this_00,index);
  pQVar8 = QFileSystemModelPrivate::node(this_00,index);
  bVar6 = QFileSystemModelPrivate::QFileSystemNode::isSymLink(pQVar8,false);
  if (bVar6) {
    bVar6 = QFileInfoGatherer::resolveSymlinks
                      ((QFileInfoGatherer *)
                       (this_00->fileInfoGatherer)._M_t.
                       super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>
                       .super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl);
    if (bVar6) {
      bVar6 = QHash<QString,_QString>::contains(&this_00->resolvedSymLinks,(QString *)&local_48);
      if (bVar6) {
        bVar6 = QFileSystemModelPrivate::QFileSystemNode::isDir(pQVar8);
        if (bVar6) {
          local_50 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          QFileSystemModelPrivate::QFileSystemNode::fileInfo((QFileSystemNode *)&local_50);
          if (pQVar8->info == (QExtendedInformation *)0x0) {
            QFileInfo::QFileInfo((QFileInfo *)(local_80 + 0x18),(QString *)&local_48);
            pDVar2 = local_50;
            local_50 = (Data *)local_68.d;
            local_68.d = (Data *)pDVar2;
            QFileInfo::~QFileInfo((QFileInfo *)(local_80 + 0x18));
          }
          local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QFileInfo::canonicalFilePath();
          QFileInfo::canonicalFilePath();
          pQVar8 = QFileSystemModelPrivate::node(this_00,(QString *)local_80,false);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_80);
          local_80._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QFileSystemModelPrivate::QFileSystemNode::fileInfo((QFileSystemNode *)local_80);
          if (pQVar8->info == (QExtendedInformation *)0x0) {
            QFileInfo::QFileInfo((QFileInfo *)&local_88,(QString *)(local_80 + 0x18));
            uVar1 = local_80._0_8_;
            local_80._0_8_ = local_88;
            local_88 = (Data *)uVar1;
            QFileInfo::~QFileInfo((QFileInfo *)&local_88);
          }
          cVar7 = QFileInfo::exists();
          if (cVar7 != '\0') {
            QFileInfo::filePath();
            QFileInfo::~QFileInfo((QFileInfo *)local_80);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)(local_80 + 0x18));
            QFileInfo::~QFileInfo((QFileInfo *)&local_50);
            goto LAB_0056e76d;
          }
          QFileInfo::~QFileInfo((QFileInfo *)local_80);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)(local_80 + 0x18));
          QFileInfo::~QFileInfo((QFileInfo *)&local_50);
        }
      }
    }
  }
  qVar5 = local_48.size;
  pcVar4 = local_48.ptr;
  pDVar3 = local_48.d;
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = pDVar3;
  (__return_storage_ptr__->d).ptr = pcVar4;
  local_48.size = 0;
  (__return_storage_ptr__->d).size = qVar5;
LAB_0056e76d:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileSystemModel::filePath(const QModelIndex &index) const
{
    Q_D(const QFileSystemModel);
    QString fullPath = d->filePath(index);
    QFileSystemModelPrivate::QFileSystemNode *dirNode = d->node(index);
    if (dirNode->isSymLink()
#if QT_CONFIG(filesystemwatcher)
        && d->fileInfoGatherer->resolveSymlinks()
#endif
        && d->resolvedSymLinks.contains(fullPath)
        && dirNode->isDir()) {
        QFileInfo fullPathInfo(dirNode->fileInfo());
        if (!dirNode->hasInformation())
            fullPathInfo = QFileInfo(fullPath);
        QString canonicalPath = fullPathInfo.canonicalFilePath();
        auto *canonicalNode = d->node(fullPathInfo.canonicalFilePath(), false);
        QFileInfo resolvedInfo = canonicalNode->fileInfo();
        if (!canonicalNode->hasInformation())
            resolvedInfo = QFileInfo(canonicalPath);
        if (resolvedInfo.exists())
            return resolvedInfo.filePath();
    }
    return fullPath;
}